

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WirehairCodec.cpp
# Opt level: O3

bool __thiscall wirehair::Codec::OpportunisticPeeling(Codec *this,uint16_t row_i,uint32_t row_seed)

{
  long lVar1;
  anon_union_2_3_10dc256e_for_PeelColumn_1 *paVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  PeelRow *pPVar6;
  PeelRefs *pPVar7;
  PeelColumn *pPVar8;
  undefined4 uVar9;
  ulong uVar10;
  ulong uVar11;
  ushort fail_column_i;
  uint uVar12;
  uint uVar13;
  uint16_t row_i_00;
  undefined6 in_register_00000032;
  uint16_t uVar14;
  uint uVar15;
  short *psVar16;
  ushort uVar17;
  uint16_t unmarked [2];
  ushort local_40 [2];
  undefined4 local_3c;
  PeelRow *local_38;
  
  pPVar6 = this->_peel_rows;
  local_3c = (undefined4)CONCAT62(in_register_00000032,row_i);
  uVar10 = CONCAT62(in_register_00000032,row_i) & 0xffffffff;
  local_38 = pPVar6 + uVar10;
  local_38->RecoveryId = row_seed;
  PeelRowParameters::Initialize
            (&pPVar6[uVar10].Params,row_seed,this->_p_seed,this->_block_count,this->_mix_count);
  uVar9 = local_3c;
  fail_column_i = pPVar6[uVar10].Params.PeelFirst;
  uVar11 = (ulong)fail_column_i;
  pPVar7 = this->_peel_col_refs;
  uVar12 = (uint)fail_column_i;
  lVar1 = (ulong)fail_column_i * 0x40 + uVar11 * 2;
  uVar17 = pPVar7->Rows[uVar11 + (ulong)fail_column_i * 0x20 + -1];
  if (uVar17 < 0x20) {
    uVar3 = pPVar6[uVar10].Params.PeelAdd;
    uVar14 = pPVar6[uVar10].Params.PeelCount;
    uVar4 = this->_block_count;
    uVar5 = this->_block_next_prime;
    pPVar8 = this->_peel_cols;
    uVar15 = 0;
    do {
      psVar16 = (short *)((long)pPVar7->Rows + lVar1 + -2);
      *psVar16 = uVar17 + 1;
      row_i_00 = (uint16_t)uVar9;
      psVar16[(ulong)uVar17 + 1] = row_i_00;
      if (pPVar8[uVar11].Mark == '\0') {
        local_40[uVar15 & 1] = (ushort)uVar12;
        uVar15 = uVar15 + 1;
      }
      uVar14 = uVar14 - 1;
      if (uVar14 == 0) {
        local_38->UnmarkedCount = (uint16_t)uVar15;
        if ((uint16_t)uVar15 == 2) {
          (local_38->Marks).Unmarked[0] = local_40[0];
          (local_38->Marks).Unmarked[1] = local_40[1];
          paVar2 = &this->_peel_cols[local_40[0]].field_1;
          paVar2->Weight2Refs = paVar2->Weight2Refs + 1;
          paVar2 = &this->_peel_cols[local_40[1]].field_1;
          paVar2->Weight2Refs = paVar2->Weight2Refs + 1;
          return true;
        }
        if ((uVar15 & 0xffff) != 1) {
          if ((uVar15 & 0xffff) != 0) {
            return true;
          }
          local_38->NextRow = this->_defer_head_rows;
          this->_defer_head_rows = row_i_00;
          return true;
        }
        SolveWithPeel(this,local_38,row_i_00,local_40[0]);
        return true;
      }
      uVar12 = ((uVar12 & 0xffff) + (uint)uVar3) % (uint)uVar5;
      if (uVar4 <= uVar12) {
        uVar12 = uVar5 - uVar12;
        uVar13 = uVar12 & 0xffff;
        if (uVar3 < (ushort)uVar12) {
          uVar12 = ((uint)uVar3 * 0x10000 - uVar13) % (uint)uVar3;
        }
        else {
          uVar12 = uVar3 - uVar13;
        }
      }
      fail_column_i = (ushort)uVar12;
      uVar11 = (ulong)(uVar12 & 0xffff);
      lVar1 = (ulong)((uVar12 & 0xffff) << 6) + uVar11 * 2;
      uVar17 = *(ushort *)((long)pPVar7->Rows + lVar1 + -2);
    } while (uVar17 < 0x20);
  }
  FixPeelFailure(this,local_38,fail_column_i);
  return false;
}

Assistant:

bool Codec::OpportunisticPeeling(
    const uint16_t row_i, ///< Row index
    const uint32_t row_seed ///< Row PRNG seed
)
{
    PeelRow *row = &_peel_rows[row_i];

    row->RecoveryId = row_seed;

    row->Params.Initialize(row_seed, _p_seed, _block_count, _mix_count);

    CAT_IF_DUMP(cout << "Row " << row_seed << " in slot " << row_i << " of weight "
        << row->Params.PeelCount << " [a=" << row->Params.PeelAdd << "] : ";)

    PeelRowIterator iter(row->Params, _block_count, _block_next_prime);

    uint16_t unmarked_count = 0;
    uint16_t unmarked[2];

    // Iterate columns in peeling matrix
    do
    {
        const uint16_t column_i = iter.GetColumn();

        CAT_IF_DUMP(cout << column_i << " ";)

        PeelRefs *refs = &_peel_col_refs[column_i];

        // If there was not enough room in the reference list:
        if (refs->RowCount >= CAT_REF_LIST_MAX)
        {
            CAT_IF_DUMP(cout << "OpportunisticPeeling: Failure!  " \
                "Ran out of space for row references.  CAT_REF_LIST_MAX must be increased!" << endl;)

            CAT_DEBUG_BREAK();

            FixPeelFailure(row, column_i);

            return false;
        }

        // Add row reference to column
        refs->Rows[refs->RowCount++] = row_i;

        // If column is unmarked:
        if (_peel_cols[column_i].Mark == MARK_TODO) {
            unmarked[unmarked_count++ & 1] = column_i;
        }
    } while (iter.Iterate());

    CAT_IF_DUMP(cout << endl;)

    // Initialize row state
    row->UnmarkedCount = unmarked_count;

    switch (unmarked_count)
    {
    case 0:
        // Link at head of defer list
        row->NextRow = _defer_head_rows;
        _defer_head_rows = row_i;
        break;

    case 1:
        // Solve only unmarked column with this row
        SolveWithPeel(
            row,
            row_i,
            unmarked[0]);
        break;

    case 2:
        // Remember which two columns were unmarked
        row->Marks.Unmarked[0] = unmarked[0];
        row->Marks.Unmarked[1] = unmarked[1];

        // Increment weight-2 reference count for unmarked columns
        _peel_cols[unmarked[0]].Weight2Refs++;
        _peel_cols[unmarked[1]].Weight2Refs++;
        break;
    }

    return true;
}